

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Object_State_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Point_Object_State_PDU::operator==
          (Point_Object_State_PDU *this,Point_Object_State_PDU *Value)

{
  KBOOL KVar1;
  Point_Object_State_PDU *Value_local;
  Point_Object_State_PDU *this_local;
  
  KVar1 = Object_State_Header::operator!=
                    (&this->super_Object_State_Header,&Value->super_Object_State_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if ((this->super_Object_State_Header).field_0x4b ==
           (Value->super_Object_State_Header).field_0x4b) {
    KVar1 = DATA_TYPE::ObjectType::operator!=(&this->m_ObjTyp,&Value->m_ObjTyp);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = DATA_TYPE::WorldCoordinates::operator!=(&this->m_Loc,&Value->m_Loc);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        KVar1 = DATA_TYPE::EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = DATA_TYPE::PointObjectAppearance::operator!=
                            (&this->m_Apperance,&Value->m_Apperance);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else {
            KVar1 = DATA_TYPE::SimulationIdentifier::operator!=(&this->m_ReqID,&Value->m_ReqID);
            if (KVar1) {
              this_local._7_1_ = false;
            }
            else {
              KVar1 = DATA_TYPE::SimulationIdentifier::operator!=(&this->m_RecvID,&Value->m_RecvID);
              if (KVar1) {
                this_local._7_1_ = false;
              }
              else {
                this_local._7_1_ = true;
              }
            }
          }
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Point_Object_State_PDU::operator == ( const Point_Object_State_PDU & Value ) const
{
    if( Object_State_Header::operator  != ( Value ) ) return false;
    if( m_ModificationUnion.m_ui8Modifications != Value.m_ModificationUnion.m_ui8Modifications ) return false;
    if( m_ObjTyp    != Value.m_ObjTyp )       return false;
    if( m_Loc       != Value.m_Loc )          return false;
    if( m_Ori       != Value.m_Ori )          return false;
    if( m_Apperance != Value.m_Apperance )    return false;
    if( m_ReqID     != Value.m_ReqID )        return false;
    if( m_RecvID    != Value.m_RecvID )       return false;
    return true;
}